

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O1

int run_test_loop_update_time(void)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int64_t eval_b;
  int64_t eval_a;
  long alStack_98 [15];
  code *pcStack_20;
  long local_18;
  long local_10;
  
  pcStack_20 = (code *)0x1ac5c2;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x1ac5ca;
  lVar3 = uv_now(uVar2);
  pcStack_20 = (code *)0x1ac5d2;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x1ac5da;
  lVar4 = uv_now(uVar2);
  uVar5 = lVar4 - lVar3;
  while (uVar5 < 1000) {
    pcStack_20 = (code *)0x1ac5ea;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1ac5f7;
    iVar1 = uv_run(uVar2,2);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 != 0) {
      pcStack_20 = (code *)0x1ac68d;
      run_test_loop_update_time_cold_1();
      goto LAB_001ac68d;
    }
    pcStack_20 = (code *)0x1ac616;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x1ac61e;
    lVar4 = uv_now(uVar2);
    uVar5 = lVar4 - lVar3;
  }
  pcStack_20 = (code *)0x1ac62e;
  lVar3 = uv_default_loop();
  pcStack_20 = (code *)0x1ac642;
  uv_walk(lVar3,close_walk_cb,0);
  pcStack_20 = (code *)0x1ac64c;
  uv_run(lVar3,0);
  local_10 = 0;
  pcStack_20 = (code *)0x1ac65a;
  uVar2 = uv_default_loop();
  pcStack_20 = (code *)0x1ac662;
  iVar1 = uv_loop_close(uVar2);
  local_18 = (long)iVar1;
  if (local_10 == local_18) {
    pcStack_20 = (code *)0x1ac678;
    uv_library_shutdown();
    return 0;
  }
LAB_001ac68d:
  pcStack_20 = run_test_loop_backend_timeout;
  run_test_loop_update_time_cold_2();
  pcStack_20 = (code *)lVar3;
  lVar4 = uv_default_loop();
  *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
  iVar1 = uv_run(lVar4,2);
  alStack_98[0] = 1;
  if (iVar1 == 1) {
    *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + -1;
    iVar1 = uv_loop_alive(lVar4);
    alStack_98[0] = (long)iVar1;
    if (alStack_98[0] != 0) goto LAB_001ac896;
    iVar1 = uv_timer_init(lVar4,alStack_98);
    if (iVar1 != 0) goto LAB_001ac8a5;
    iVar1 = uv_loop_alive(lVar4);
    if (iVar1 != 0) goto LAB_001ac8b4;
    iVar1 = uv_backend_timeout(lVar4);
    if (iVar1 != 0) goto LAB_001ac8c3;
    iVar1 = uv_timer_start(alStack_98,cb,1000,0);
    if (iVar1 != 0) goto LAB_001ac8d2;
    iVar1 = uv_backend_timeout(lVar4);
    if (iVar1 != 1000) goto LAB_001ac8e1;
    iVar1 = uv_run(lVar4,0);
    if (iVar1 != 0) goto LAB_001ac8f0;
    iVar1 = uv_backend_timeout(lVar4);
    if (iVar1 == 0) {
      uv_walk(lVar4,close_walk_cb,0);
      uv_run(lVar4,0);
      iVar1 = uv_loop_close(lVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001ac90e;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_001ac896:
    run_test_loop_backend_timeout_cold_2();
LAB_001ac8a5:
    run_test_loop_backend_timeout_cold_3();
LAB_001ac8b4:
    run_test_loop_backend_timeout_cold_4();
LAB_001ac8c3:
    run_test_loop_backend_timeout_cold_5();
LAB_001ac8d2:
    run_test_loop_backend_timeout_cold_6();
LAB_001ac8e1:
    run_test_loop_backend_timeout_cold_7();
LAB_001ac8f0:
    run_test_loop_backend_timeout_cold_8();
  }
  run_test_loop_backend_timeout_cold_9();
LAB_001ac90e:
  run_test_loop_backend_timeout_cold_10();
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(loop_update_time) {
  uint64_t start;

  start = uv_now(uv_default_loop());
  while (uv_now(uv_default_loop()) - start < 1000)
    ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}